

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::preprocessor::process_endline
          (preprocessor *this,context_t *context,compiler_type *compiler,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset *encoding)

{
  token_base *ptVar1;
  long lVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  void *pvVar6;
  undefined8 uVar7;
  string *code;
  char *__lhs;
  element_type *peVar8;
  ulong uVar9;
  reference pptVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long *in_RDI;
  undefined4 *in_R8;
  token_base *ptr;
  reverse_iterator it;
  exception_conflict *e;
  exception *e_1;
  string_conflict version_str;
  charset in_stack_000003bc;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_000003c0;
  deque<char,_std::allocator<char>_> *in_stack_000003c8;
  compiler_type *in_stack_000003d0;
  string_conflict arg;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  preprocessor *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  reverse_iterator<std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>_>
  *in_stack_fffffffffffffb80;
  deque<char,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  allocator *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  string *in_stack_fffffffffffffbc0;
  string *psVar12;
  string *in_stack_fffffffffffffbc8;
  string *in_stack_fffffffffffffbd0;
  size_t in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  allocator local_309;
  string local_308 [38];
  undefined1 local_2e2;
  allocator local_2e1;
  string local_2e0 [96];
  string local_280 [39];
  undefined1 local_259;
  string local_198 [39];
  allocator local_171;
  string local_170 [38];
  undefined1 local_14a;
  allocator local_149;
  string local_148 [128];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  long local_48;
  void *local_30;
  undefined4 *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    local_20 = in_RCX;
    if ((*(byte *)((long)in_RDI + 0x11) & 1) != 0) {
      *(undefined1 *)((long)in_RDI + 0x11) = 0;
      local_28 = in_R8;
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
      if ((bVar3) && ((*(byte *)((long)in_RDI + 0x12) & 1) == 0)) {
        *(undefined1 *)((long)in_RDI + 0x12) = 1;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
        if ((bVar3) && ((*(byte *)((long)in_RDI + 0x12) & 1) != 0)) {
          pvVar6 = token_base::operator_new((size_t)in_stack_fffffffffffffb70);
          token_endline::token_endline
                    ((token_endline *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68);
          local_30 = pvVar6;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
          *(undefined1 *)((long)in_RDI + 0x12) = 0;
        }
        else {
          local_48 = std::__cxx11::string::find((char)in_RDI + 'h',0x3a);
          std::__cxx11::string::string(local_68);
          if (local_48 != -1) {
            std::__cxx11::string::substr((ulong)local_88,(ulong)(in_RDI + 0xd));
            std::__cxx11::string::operator=(local_68,local_88);
            std::__cxx11::string::~string(local_88);
            std::__cxx11::string::substr((ulong)local_a8,(ulong)(in_RDI + 0xd));
            std::__cxx11::string::operator=((string *)(in_RDI + 0xd),local_a8);
            std::__cxx11::string::~string(local_a8);
          }
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
          if (bVar3) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
            if (bVar3) {
              *local_28 = 0;
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68
                                     );
              if (bVar3) {
                *local_28 = 1;
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffb70,
                                        (char *)in_stack_fffffffffffffb68);
                if (!bVar3) {
                  local_14a = 1;
                  uVar7 = __cxa_allocate_exception(0x90);
                  peVar8 = std::
                           __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x5c2302);
                  std::__cxx11::string::string(local_c8,(string *)&peVar8->file_path);
                  std::operator+(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
                  std::operator+(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
                  std::operator+((any *)in_stack_fffffffffffffb78,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb70);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_148,"Unavailable encoding.",&local_149);
                  exception::exception
                            ((exception *)
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                             in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
                  local_14a = 0;
                  __cxa_throw(uVar7,&exception::typeinfo,exception::~exception);
                }
                *local_28 = 2;
              }
            }
          }
          else {
            uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
            if (!(bool)uVar4) {
              __lhs = (char *)__cxa_allocate_exception(0x90);
              psVar12 = (string *)in_RDI[1];
              peVar8 = std::
                       __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x5c2880);
              std::__cxx11::string::string(local_280,(string *)&peVar8->file_path);
              std::operator+(__lhs,in_stack_fffffffffffffbb0);
              uVar9 = std::__cxx11::string::empty();
              local_2e2 = 0;
              if ((uVar9 & 1) == 0) {
                std::operator+(__lhs,in_stack_fffffffffffffbb0);
              }
              else {
                paVar11 = &local_2e1;
                std::allocator<char>::allocator();
                local_2e2 = 1;
                std::__cxx11::string::string(local_2e0,"",paVar11);
              }
              std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
              paVar11 = &local_309;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_308,"Wrong grammar for preprocessor command.",paVar11);
              exception::exception
                        ((exception *)CONCAT17(uVar4,in_stack_fffffffffffffbe0),
                         in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                         in_stack_fffffffffffffbc8,psVar12);
              __cxa_throw(__lhs,&exception::typeinfo,exception::~exception);
            }
            paVar11 = &local_171;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_170,"210508",paVar11);
            std::allocator<char>::~allocator((allocator<char> *)&local_171);
            bVar3 = std::operator>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
            if (bVar3) {
              local_259 = 1;
              code = (string *)__cxa_allocate_exception(0x90);
              psVar12 = (string *)in_RDI[1];
              peVar8 = std::
                       __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x5c25b7);
              std::__cxx11::string::string(local_198,(string *)&peVar8->file_path);
              std::operator+(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
              std::operator+(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
              std::operator+((any *)in_stack_fffffffffffffb78,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb70);
              std::operator+(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
              std::operator+(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
              std::operator+((any *)in_stack_fffffffffffffb78,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb70);
              exception::exception
                        ((exception *)CONCAT17(uVar4,in_stack_fffffffffffffbe0),(size_t)paVar11,
                         psVar12,code,in_stack_fffffffffffffbc0);
              local_259 = 0;
              __cxa_throw(code,&exception::typeinfo,exception::~exception);
            }
            std::__cxx11::string::~string(local_170);
          }
          std::__cxx11::string::~string(local_68);
        }
      }
      std::__cxx11::string::clear();
    }
    if ((*(byte *)((long)in_RDI + 0x13) & 1) == 0) {
      process_char_buff(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003bc);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::rbegin
                (in_stack_fffffffffffffb98);
      while( true ) {
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::rend
                  (in_stack_fffffffffffffb98);
        bVar3 = std::operator!=((reverse_iterator<std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>_>
                                 *)in_stack_fffffffffffffb70,
                                (reverse_iterator<std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>_>
                                 *)in_stack_fffffffffffffb68);
        if (!bVar3) break;
        pptVar10 = std::
                   reverse_iterator<std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>_>
                   ::operator*(in_stack_fffffffffffffb80);
        if (*pptVar10 != (token_base *)0x0) {
          pptVar10 = std::
                     reverse_iterator<std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>_>
                     ::operator*(in_stack_fffffffffffffb80);
          ptVar1 = *pptVar10;
          iVar5 = (*ptVar1->_vptr_token_base[2])();
          if (iVar5 == 1) break;
          ptVar1->line_num = in_RDI[1];
        }
        std::
        reverse_iterator<std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>_>
        ::operator++((reverse_iterator<std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>_>
                      *)in_stack_fffffffffffffb70);
      }
      if ((*(byte *)((long)in_RDI + 0x12) & 1) == 0) {
        in_stack_fffffffffffffb70 =
             (preprocessor *)token_base::operator_new((size_t)in_stack_fffffffffffffb70);
        token_endline::token_endline((token_endline *)in_stack_fffffffffffffb70,(size_t)local_20);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffb70,(value_type *)local_20);
        in_stack_fffffffffffffb68 = local_20;
      }
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5c2f24);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      lVar2 = in_RDI[1];
      in_RDI[1] = lVar2 + 1;
      *in_RDI = lVar2;
      std::deque<char,_std::allocator<char>_>::clear(in_stack_fffffffffffffb90);
      std::__cxx11::string::clear();
      *(undefined1 *)((long)in_RDI + 0x13) = 1;
      *(undefined1 *)((long)in_RDI + 0x14) = 1;
    }
    else {
      new_empty_line(in_stack_fffffffffffffb70,(context_t *)in_stack_fffffffffffffb68);
    }
  }
  else {
    *(undefined1 *)(in_RDI + 2) = 0;
    new_empty_line(in_stack_fffffffffffffb70,(context_t *)in_stack_fffffffffffffb68);
  }
  return;
}

Assistant:

void process_endline(const context_t &context, compiler_type &compiler, std::deque<token_base *> &tokens,
		                     charset &encoding)
		{
			if (is_annotation) {
				is_annotation = false;
				new_empty_line(context);
				return;
			}
			if (is_command) {
				is_command = false;
				if (command == "begin" && !multi_line)
					multi_line = true;
				else if (command == "end" && multi_line) {
					tokens.push_back(new token_endline(last_line_num));
					multi_line = false;
				}
				else {
					auto pos = command.find(':');
					std::string arg;
					if (pos != std::string::npos) {
						arg = command.substr(pos + 1);
						command = command.substr(0, pos);
					}
					if (command == "charset") {
						if (arg == "ascii")
							encoding = charset::ascii;
						else if (arg == "utf8")
							encoding = charset::utf8;
						else if (arg == "gbk")
							encoding = charset::gbk;
						else
							throw exception(line_num, context->file_path, "@" + command + ": " + arg,
							                "Unavailable encoding.");
					}
					else if (command == "require") {
						std::string version_str = CS_GET_VERSION_STR(COVSCRIPT_STD_VERSION);
						if (arg > version_str)
							throw exception(line_num, context->file_path, "@" + command + ": " + arg,
							                "Newer Language Standard required: " + arg + ", now on " + version_str);
					}
					else
						throw exception(line_num, context->file_path, "@" + command + (arg.empty() ? "" : ": " + arg),
						                "Wrong grammar for preprocessor command.");
				}
				command.clear();
			}
			if (empty_buff) {
				new_empty_line(context);
				return;
			}
			try {
				compiler.process_char_buff(buff, tokens, encoding);
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(line_num, context->file_path, line, e.what());
			}
			for (auto it = tokens.rbegin(); it != tokens.rend(); ++it) {
				if (*it != nullptr) {
					token_base *ptr = *it;
					if (ptr->get_type() == token_types::endline)
						break;
					else
						ptr->line_num = line_num;
				}
			}
			if (!multi_line)
				tokens.push_back(new token_endline(line_num));
			context->file_buff.emplace_back(line);
			last_line_num = line_num++;
			buff.clear();
			line.clear();
			empty_buff = true;
			empty_line = true;
		}